

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::GetEnv(char *key,string *result)

{
  char *pcVar1;
  
  pcVar1 = getenv(key);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)result);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool SystemTools::GetEnv(const char* key, std::string& result)
{
#if defined(_WIN32)
  auto wide_key = Encoding::ToWide(key);
  auto result_size = GetEnvironmentVariableW(wide_key.data(), nullptr, 0);
  if (result_size <= 0) {
    return false;
  }
  std::wstring wide_result;
  wide_result.resize(result_size - 1);
  GetEnvironmentVariableW(wide_key.data(), &wide_result[0], result_size);
  result = Encoding::ToNarrow(wide_result);
  return true;
#else
  const char* v = getenv(key);
  if (v) {
    result = v;
    return true;
  }
#endif
  return false;
}